

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialAnalyzerSettings.cpp
# Opt level: O1

void __thiscall
SimpleSerialAnalyzerSettings::SimpleSerialAnalyzerSettings(SimpleSerialAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *this_00;
  AnalyzerSettingInterfaceInteger *this_01;
  int iVar1;
  uint uVar2;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SimpleSerialAnalyzerSettings_00107d68;
  Channel::Channel(&this->mInputChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mBitRate = 0x2580;
  this_00 = &this->mInputChannelInterface;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  this_01 = &this->mBitRateInterface;
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_01);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_00,"Serial");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_00);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01,"Bit Rate (Bits/S)");
  iVar1 = (int)this_01;
  AnalyzerSettingInterfaceInteger::SetMax(iVar1);
  AnalyzerSettingInterfaceInteger::SetMin(iVar1);
  AnalyzerSettingInterfaceInteger::SetInteger(iVar1);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar2 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar2,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar2,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar2,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return;
}

Assistant:

SimpleSerialAnalyzerSettings::SimpleSerialAnalyzerSettings()
:	mInputChannel( UNDEFINED_CHANNEL ),
	mBitRate( 9600 ),
	mInputChannelInterface(),
	mBitRateInterface()
{
	mInputChannelInterface.SetTitleAndTooltip( "Serial", "Standard Simple Serial" );
	mInputChannelInterface.SetChannel( mInputChannel );

	mBitRateInterface.SetTitleAndTooltip( "Bit Rate (Bits/S)",  "Specify the bit rate in bits per second." );
	mBitRateInterface.SetMax( 6000000 );
	mBitRateInterface.SetMin( 1 );
	mBitRateInterface.SetInteger( mBitRate );

	AddInterface( &mInputChannelInterface );
	AddInterface( &mBitRateInterface );

	AddExportOption( 0, "Export as text/csv file" );
	AddExportExtension( 0, "text", "txt" );
	AddExportExtension( 0, "csv", "csv" );

	ClearChannels();
	AddChannel( mInputChannel, "Serial", false );
}